

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall despot::util::tinyxml::TiXmlNode::RemoveChild(TiXmlNode *this,TiXmlNode *removeThis)

{
  TiXmlNode *removeThis_local;
  TiXmlNode *this_local;
  
  if (removeThis->parent != this) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x11c,"bool despot::util::tinyxml::TiXmlNode::RemoveChild(TiXmlNode *)");
  }
  if (removeThis->next == (TiXmlNode *)0x0) {
    this->lastChild = removeThis->prev;
  }
  else {
    removeThis->next->prev = removeThis->prev;
  }
  if (removeThis->prev == (TiXmlNode *)0x0) {
    this->firstChild = removeThis->next;
  }
  else {
    removeThis->prev->next = removeThis->next;
  }
  if (removeThis != (TiXmlNode *)0x0) {
    (*(removeThis->super_TiXmlBase)._vptr_TiXmlBase[1])();
  }
  return true;
}

Assistant:

bool TiXmlNode::RemoveChild(TiXmlNode* removeThis) {
	if (removeThis->parent != this) {
		assert(0);
		return false;
	}

	if (removeThis->next)
		removeThis->next->prev = removeThis->prev;
	else
		lastChild = removeThis->prev;

	if (removeThis->prev)
		removeThis->prev->next = removeThis->next;
	else
		firstChild = removeThis->next;

	delete removeThis;
	return true;
}